

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBar::hideOrShow(QStatusBar *this)

{
  QStatusBarPrivate *this_00;
  long lVar1;
  long lVar2;
  SBItem *pSVar3;
  QWidget *this_01;
  undefined1 auVar4 [16];
  bool bVar5;
  char cVar6;
  long lVar7;
  long in_FS_OFFSET;
  QRect local_58;
  QStatusBar *pQStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
  lVar1 = (this_00->items).d.size;
  if (lVar1 != 0) {
    lVar2 = (this_00->tempItem).d.size;
    pSVar3 = (this_00->items).d.ptr;
    lVar7 = 0;
    do {
      if (*(int *)((long)&pSVar3->category + lVar7) == 1) break;
      this_01 = *(QWidget **)((long)&pSVar3->widget + lVar7);
      if (lVar2 == 0) {
        bVar5 = QWidget::testAttribute_helper(this_01,WA_WState_ExplicitShowHide);
        if (!bVar5) {
          QWidget::show(*(QWidget **)((long)&pSVar3->widget + lVar7));
        }
      }
      else if ((this_01->data->widget_attributes & 0x8000) != 0) {
        QWidget::hide(this_01);
        QWidget::setAttribute
                  (*(QWidget **)((long)&pSVar3->widget + lVar7),WA_WState_ExplicitShowHide,false);
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar1 << 4 != lVar7);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = &this_00->tempItem;
  local_58 = (QRect)(auVar4 << 0x40);
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
  cVar6 = QAccessible::isActive();
  if (cVar6 != '\0') {
    local_58.x2.m_i = 0x800c;
    local_58._0_8_ = QFont::strikeOut;
    local_58.y2.m_i = -0x55555556;
    local_40 = 0xaaaaaaaaffffffff;
    pQStack_48 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
  }
  local_58 = QStatusBarPrivate::messageRect(this_00);
  QWidget::update(&this->super_QWidget,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::hideOrShow()
{
    Q_D(QStatusBar);
    bool haveMessage = !d->tempItem.isEmpty();

    for (const auto &item : std::as_const(d->items)) {
        if (item.isPermanent())
            break;
        if (haveMessage && item.widget->isVisible()) {
            item.widget->hide();
            item.widget->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
        } else if (!haveMessage && !item.widget->testAttribute(Qt::WA_WState_ExplicitShowHide)) {
            item.widget->show();
        }
    }

    emit messageChanged(d->tempItem);

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif

    update(d->messageRect());
}